

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O0

OpenMDBitSet * __thiscall OpenMD::OpenMDBitSet::parallelReduce(OpenMDBitSet *this)

{
  _Bit_iterator __last;
  _Bit_iterator __first;
  back_insert_iterator<std::vector<bool,_std::allocator<bool>_>_> __result;
  uint uVar1;
  vector<bool,_std::allocator<bool>_> *in_RSI;
  OpenMDBitSet *in_RDI;
  iterator iVar2;
  OpenMDBitSet *result;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffffd4;
  vector<bool,_std::allocator<bool>_> *pvVar3;
  uint uVar4;
  undefined1 in_stack_ffffffffffffffe4 [11];
  undefined1 uVar5;
  
  uVar5 = 0;
  OpenMDBitSet((OpenMDBitSet *)0x1a92ce);
  iVar2 = std::vector<bool,_std::allocator<bool>_>::begin
                    ((vector<bool,_std::allocator<bool>_> *)0x1a92d8);
  __result.container = (vector<bool,_std::allocator<bool>_> *)iVar2.super__Bit_iterator_base._M_p;
  uVar1 = iVar2.super__Bit_iterator_base._M_offset;
  pvVar3 = __result.container;
  uVar4 = uVar1;
  std::vector<bool,_std::allocator<bool>_>::end(in_RSI);
  std::back_inserter<std::vector<bool,std::allocator<bool>>>(in_stack_ffffffffffffff58);
  __first.super__Bit_iterator_base._4_11_ = in_stack_ffffffffffffffe4;
  __first.super__Bit_iterator_base._M_p._0_4_ = uVar4;
  __first.super__Bit_iterator_base._15_1_ = uVar5;
  __last.super__Bit_iterator_base._M_p._4_4_ = in_stack_ffffffffffffffd4;
  __last.super__Bit_iterator_base._M_p._0_4_ = uVar1;
  __last.super__Bit_iterator_base._8_8_ = pvVar3;
  std::copy<std::_Bit_iterator,std::back_insert_iterator<std::vector<bool,std::allocator<bool>>>>
            (__first,__last,__result);
  return in_RDI;
}

Assistant:

OpenMDBitSet OpenMDBitSet::parallelReduce() {
    OpenMDBitSet result;

#ifdef IS_MPI

    // This is necessary because std::vector<bool> isn't really a
    // std::vector, so we can't pass the address of the first element
    // to the MPI call that follows.  We first have to convert to a
    // std::vector<int> to do the logical_or Allreduce call, then back
    // convert it into the vector<bool>.

    std::vector<int> bsInt(bitset_.begin(), bitset_.end());

    MPI_Allreduce(MPI_IN_PLACE, &bsInt[0], bsInt.size(), MPI_INT, MPI_LOR,
                  MPI_COMM_WORLD);

    std::transform(bsInt.begin(), bsInt.end(),
                   std::back_inserter(result.bitset_),
                   [](int val) { return val != 0; });
#else
    // Not in MPI?  Just return a copy of the current bitset:
    std::copy(bitset_.begin(), bitset_.end(),
              std::back_inserter(result.bitset_));
#endif

    return result;
  }